

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O1

void __thiscall ELLIPSOID::ELLIPSOID(ELLIPSOID *this,double a_,double b_)

{
  double dVar1;
  double dVar2;
  
  this->a = a_;
  this->b = b_;
  dVar1 = a_ * a_;
  this->c = dVar1 / b_;
  this->alpha = (a_ - b_) / a_;
  dVar2 = dVar1 - b_ * b_;
  this->e2 = dVar2 / dVar1;
  this->e1_2 = dVar2 / (b_ * b_);
  return;
}

Assistant:

ELLIPSOID::ELLIPSOID(double a_, double b_)
{
    this->a = a_;
    this->b = b_;
    this->c = this->a * this->a / this->b;
    this->alpha = (this->a - this->b) / this->a;
    this->e2 = (this->a * this->a - this->b * this->b) / (this->a * this->a);
    this->e1_2 = (this->a * this->a - this->b * this->b) / (this->b * this->b);
}